

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

void duckdb::DecimalRoundPositivePrecisionFunction<long,duckdb::NumericHelper>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  long lVar1;
  ulong count;
  long *plVar2;
  long *plVar3;
  unsigned_long *puVar4;
  data_ptr_t pdVar5;
  ulong uVar6;
  data_ptr_t pdVar7;
  sel_t *psVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  byte bVar11;
  BoundFunctionExpression *pBVar12;
  pointer pFVar13;
  const_reference this_00;
  pointer pEVar14;
  reference vector;
  long lVar15;
  TemplatedValidityData<unsigned_long> *pTVar16;
  _Head_base<0UL,_unsigned_long_*,_false> _Var17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  idx_t idx_in_entry;
  ulong uVar23;
  long lVar24;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  long local_98;
  data_ptr_t local_90;
  buffer_ptr<ValidityBuffer> *local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  pBVar12 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  pFVar13 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->(&pBVar12->bind_info);
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](&pBVar12->children,0);
  pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(this_00);
  bVar11 = DecimalType::GetScale(&pEVar14->return_type);
  lVar1 = *(long *)(NumericHelper::POWERS_OF_TEN +
                   ((ulong)bVar11 - (long)*(int *)&pFVar13[1]._vptr_FunctionData) * 8);
  lVar24 = lVar1 / 2;
  vector = vector<duckdb::Vector,_true>::operator[](&input->data,0);
  count = input->count;
  if (vector->vector_type == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar7 = result->data;
    pdVar5 = vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar4 == (unsigned_long *)0x0) {
      if (count != 0) {
        uVar23 = 0;
        do {
          lVar19 = lVar24;
          if (*(long *)(pdVar5 + uVar23 * 8) < 0) {
            lVar19 = -lVar24;
          }
          *(long *)(pdVar7 + uVar23 * 8) = (lVar19 + *(long *)(pdVar5 + uVar23 * 8)) / lVar1;
          uVar23 = uVar23 + 1;
        } while (count != uVar23);
      }
    }
    else {
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar4;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      if (0x3f < count + 0x3f) {
        puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        uVar20 = 0;
        uVar23 = 0;
        do {
          if (puVar4 == (unsigned_long *)0x0) {
            uVar21 = uVar23 + 0x40;
            if (count <= uVar23 + 0x40) {
              uVar21 = count;
            }
LAB_01bc04ee:
            uVar22 = uVar23;
            if (uVar23 < uVar21) {
              do {
                lVar19 = lVar24;
                if (*(long *)(pdVar5 + uVar23 * 8) < 0) {
                  lVar19 = -lVar24;
                }
                *(long *)(pdVar7 + uVar23 * 8) = (lVar19 + *(long *)(pdVar5 + uVar23 * 8)) / lVar1;
                uVar23 = uVar23 + 1;
                uVar22 = uVar21;
              } while (uVar21 != uVar23);
            }
          }
          else {
            uVar6 = puVar4[uVar20];
            uVar21 = uVar23 + 0x40;
            if (count <= uVar23 + 0x40) {
              uVar21 = count;
            }
            uVar22 = uVar21;
            if (uVar6 != 0) {
              if (uVar6 == 0xffffffffffffffff) goto LAB_01bc04ee;
              uVar22 = uVar23;
              if (uVar23 < uVar21) {
                uVar18 = 0;
                do {
                  if ((uVar6 >> (uVar18 & 0x3f) & 1) != 0) {
                    lVar19 = lVar24;
                    if (*(long *)(pdVar5 + uVar18 * 8 + uVar23 * 8) < 0) {
                      lVar19 = -lVar24;
                    }
                    *(long *)(pdVar7 + uVar18 * 8 + uVar23 * 8) =
                         (lVar19 + *(long *)(pdVar5 + uVar18 * 8 + uVar23 * 8)) / lVar1;
                  }
                  uVar18 = uVar18 + 1;
                  uVar22 = uVar21;
                } while (uVar21 - uVar23 != uVar18);
              }
            }
          }
          uVar20 = uVar20 + 1;
          uVar23 = uVar22;
        } while (uVar20 != count + 0x3f >> 6);
      }
    }
  }
  else if (vector->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    plVar2 = (long *)result->data;
    plVar3 = (long *)vector->data;
    puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar4 != (unsigned_long *)0x0) && ((*puVar4 & 1) == 0)) {
      ConstantVector::SetNull(result,true);
      return;
    }
    ConstantVector::SetNull(result,false);
    lVar19 = -lVar24;
    if (-1 < *plVar3) {
      lVar19 = lVar24;
    }
    *plVar2 = (lVar19 + *plVar3) / lVar1;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(vector,count,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar7 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar8 = (local_78.sel)->sel_vector;
        uVar23 = 0;
        do {
          uVar20 = uVar23;
          if (psVar8 != (sel_t *)0x0) {
            uVar20 = (ulong)psVar8[uVar23];
          }
          lVar19 = lVar24;
          if (*(long *)(local_78.data + uVar20 * 8) < 0) {
            lVar19 = -lVar24;
          }
          *(long *)(pdVar7 + uVar23 * 8) = (lVar19 + *(long *)(local_78.data + uVar20 * 8)) / lVar1;
          uVar23 = uVar23 + 1;
        } while (count != uVar23);
      }
    }
    else if (count != 0) {
      psVar8 = (local_78.sel)->sel_vector;
      local_88 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      lVar19 = -lVar24;
      uVar23 = 0;
      local_90 = local_78.data;
      local_98 = lVar19;
      do {
        uVar20 = uVar23;
        if (psVar8 != (sel_t *)0x0) {
          uVar20 = (ulong)psVar8[uVar23];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar20 >> 6]
             >> (uVar20 & 0x3f) & 1) == 0) {
          _Var17._M_head_impl =
               (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (_Var17._M_head_impl == (unsigned_long *)0x0) {
            local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_a8,&local_80);
            p_Var10 = p_Stack_a0;
            peVar9 = local_a8;
            local_a8 = (element_type *)0x0;
            p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar9;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var10;
            if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
               p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
            }
            pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_88);
            _Var17._M_head_impl =
                 (pTVar16->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var17._M_head_impl;
            lVar19 = local_98;
            local_78.data = local_90;
          }
          bVar11 = (byte)uVar23 & 0x3f;
          _Var17._M_head_impl[uVar23 >> 6] =
               _Var17._M_head_impl[uVar23 >> 6] &
               (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
        }
        else {
          lVar15 = lVar24;
          if (*(long *)(local_78.data + uVar20 * 8) < 0) {
            lVar15 = lVar19;
          }
          *(long *)(pdVar7 + uVar23 * 8) = (lVar15 + *(long *)(local_78.data + uVar20 * 8)) / lVar1;
        }
        uVar23 = uVar23 + 1;
      } while (count != uVar23);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void DecimalRoundPositivePrecisionFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RoundPrecisionFunctionData>();
	auto source_scale = DecimalType::GetScale(func_expr.children[0]->return_type);
	T power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[source_scale - info.target_scale]);
	T addition = power_of_ten / 2;
	UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
		if (input < 0) {
			input -= addition;
		} else {
			input += addition;
		}
		return UnsafeNumericCast<T>(input / power_of_ten);
	});
}